

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# udp_echo_client.cpp
# Opt level: O2

void HaveATest(Socket *sock,InetAddress *serverAddr)

{
  sz_sock sock_00;
  bool bVar1;
  sockaddr *addr;
  sz_ssize_t sVar2;
  self *psVar3;
  LogStream *pLVar4;
  SourceFile file;
  SourceFile file_00;
  SourceFile file_01;
  SourceFile file_02;
  SourceFile file_03;
  SourceFile file_04;
  SourceFile file_05;
  SourceFile file_06;
  SourceFile file_07;
  SourceFile file_08;
  SourceFile file_09;
  SourceFile file_10;
  SourceFile file_11;
  SourceFile file_12;
  SourceFile file_13;
  SourceFile file_14;
  SourceFile file_15;
  SourceFile file_16;
  SourceFile file_17;
  SourceFile file_18;
  SourceFile file_19;
  SourceFile file_20;
  SourceFile file_21;
  SourceFile file_22;
  Logger local_1190;
  undefined1 local_1c0 [12];
  undefined1 local_1b0 [12];
  undefined1 local_1a0 [12];
  undefined1 local_190 [12];
  undefined1 local_180 [12];
  undefined1 local_170 [12];
  undefined1 local_160 [12];
  undefined1 local_150 [12];
  undefined1 local_140 [12];
  undefined1 local_130 [12];
  undefined1 local_120 [12];
  undefined1 local_110 [12];
  undefined1 local_100 [12];
  undefined1 local_f0 [12];
  undefined1 local_e0 [12];
  undefined1 local_d0 [12];
  undefined1 local_c0 [12];
  undefined1 local_b0 [12];
  undefined1 local_a0 [12];
  undefined1 local_90 [12];
  undefined1 local_80 [12];
  undefined1 local_70 [12];
  undefined1 local_60 [12];
  undefined1 local_50 [12];
  char local_40 [8];
  char recv [10];
  
  addr = sznet::net::sockets::sz_sockaddr_cast((sockaddr_in6 *)serverAddr);
  sock_00 = sock->m_sockfd;
  recv[0] = '\0';
  recv[1] = '\0';
  local_40[0] = '\0';
  local_40[1] = '\0';
  local_40[2] = '\0';
  local_40[3] = '\0';
  local_40[4] = '\0';
  local_40[5] = '\0';
  local_40[6] = '\0';
  local_40[7] = '\0';
  if (sznet::g_logLevel < 3) {
    sznet::Logger::SourceFile::SourceFile<115>
              ((SourceFile *)local_1c0,
               (char (*) [115])
               "/workspace/llm4binary/github/license_all_cmakelists_25/SunshineZzzz[P]sznet/test/echo/udp_echo/udp_echo_client.cpp"
              );
    file._12_4_ = 0;
    file.m_data = (char *)local_1c0._0_8_;
    file.m_size = local_1c0._8_4_;
    sznet::Logger::Logger(&local_1190,file,0x36);
    sznet::LogStream::operator<<(&local_1190.m_impl.m_stream,"TEST1 BEGIN, no connect, block");
    sznet::Logger::~Logger(&local_1190);
  }
  sVar2 = sznet::net::sockets::sz_udp_send(sock_00,"hello",5,addr);
  if (sznet::g_logLevel < 3) {
    sznet::Logger::SourceFile::SourceFile<115>
              ((SourceFile *)local_1b0,
               (char (*) [115])
               "/workspace/llm4binary/github/license_all_cmakelists_25/SunshineZzzz[P]sznet/test/echo/udp_echo/udp_echo_client.cpp"
              );
    file_00._12_4_ = 0;
    file_00.m_data = (char *)local_1b0._0_8_;
    file_00.m_size = local_1b0._8_4_;
    sznet::Logger::Logger(&local_1190,file_00,0x38);
    psVar3 = sznet::LogStream::operator<<(&local_1190.m_impl.m_stream,"sz_udp_send rst: ");
    sznet::LogStream::operator<<(psVar3,sVar2);
    sznet::Logger::~Logger(&local_1190);
  }
  sVar2 = sznet::net::sockets::sz_udp_recv(sock_00,local_40,10,addr);
  if (sVar2 < 0) {
    sznet::Logger::SourceFile::SourceFile<115>
              ((SourceFile *)local_1a0,
               (char (*) [115])
               "/workspace/llm4binary/github/license_all_cmakelists_25/SunshineZzzz[P]sznet/test/echo/udp_echo/udp_echo_client.cpp"
              );
    file_02._12_4_ = 0;
    file_02.m_data = (char *)local_1a0._0_8_;
    file_02.m_size = local_1a0._8_4_;
    sznet::Logger::Logger(&local_1190,file_02,0x3d,false);
    psVar3 = sznet::LogStream::operator<<(&local_1190.m_impl.m_stream,"sz_udp_recv error: ");
    sznet::LogStream::operator<<(psVar3,sVar2);
LAB_00110a2b:
    sznet::Logger::~Logger(&local_1190);
    if (sznet::g_logLevel < 3) {
      sznet::Logger::SourceFile::SourceFile<115>
                ((SourceFile *)local_180,
                 (char (*) [115])
                 "/workspace/llm4binary/github/license_all_cmakelists_25/SunshineZzzz[P]sznet/test/echo/udp_echo/udp_echo_client.cpp"
                );
      file_03._12_4_ = 0;
      file_03.m_data = (char *)local_180._0_8_;
      file_03.m_size = local_180._8_4_;
      sznet::Logger::Logger(&local_1190,file_03,0x45);
      sznet::LogStream::operator<<(&local_1190.m_impl.m_stream,"TEST1 END, no connect, block");
      sznet::Logger::~Logger(&local_1190);
      if (sznet::g_logLevel < 3) {
        sznet::Logger::SourceFile::SourceFile<115>
                  ((SourceFile *)local_170,
                   (char (*) [115])
                   "/workspace/llm4binary/github/license_all_cmakelists_25/SunshineZzzz[P]sznet/test/echo/udp_echo/udp_echo_client.cpp"
                  );
        file_04._12_4_ = 0;
        file_04.m_data = (char *)local_170._0_8_;
        file_04.m_size = local_170._8_4_;
        sznet::Logger::Logger(&local_1190,file_04,0x53);
        sznet::LogStream::operator<<(&local_1190.m_impl.m_stream,"TEST2 BEGIN, connect, block");
        sznet::Logger::~Logger(&local_1190);
      }
    }
  }
  else {
    recv[sVar2 + -8] = '\0';
    if (sznet::g_logLevel < 3) {
      sznet::Logger::SourceFile::SourceFile<115>
                ((SourceFile *)local_190,
                 (char (*) [115])
                 "/workspace/llm4binary/github/license_all_cmakelists_25/SunshineZzzz[P]sznet/test/echo/udp_echo/udp_echo_client.cpp"
                );
      file_01._12_4_ = 0;
      file_01.m_data = (char *)local_190._0_8_;
      file_01.m_size = local_190._8_4_;
      sznet::Logger::Logger(&local_1190,file_01,0x42);
      psVar3 = sznet::LogStream::operator<<(&local_1190.m_impl.m_stream,"sz_udp_recv rst: ");
      pLVar4 = sznet::LogStream::operator<<(psVar3,sVar2);
      psVar3 = sznet::LogStream::operator<<(pLVar4,", recv msg: ");
      sznet::LogStream::operator<<(psVar3,local_40);
      goto LAB_00110a2b;
    }
  }
  sznet::net::sockets::sz_sock_connect(sock_00,addr);
  sVar2 = sznet::net::sockets::sz_udp_send(sock_00,"hello",5,addr);
  if (sVar2 < 0) {
    sznet::Logger::SourceFile::SourceFile<115>
              ((SourceFile *)local_160,
               (char (*) [115])
               "/workspace/llm4binary/github/license_all_cmakelists_25/SunshineZzzz[P]sznet/test/echo/udp_echo/udp_echo_client.cpp"
              );
    file_08._12_4_ = 0;
    file_08.m_data = (char *)local_160._0_8_;
    file_08.m_size = local_160._8_4_;
    sznet::Logger::Logger(&local_1190,file_08,0x59,false);
    psVar3 = sznet::LogStream::operator<<
                       (&local_1190.m_impl.m_stream,"first call sz_udp_recv error: ");
    sznet::LogStream::operator<<(psVar3,sVar2);
    goto LAB_0011123b;
  }
  if (sznet::g_logLevel < 3) {
    sznet::Logger::SourceFile::SourceFile<115>
              ((SourceFile *)local_150,
               (char (*) [115])
               "/workspace/llm4binary/github/license_all_cmakelists_25/SunshineZzzz[P]sznet/test/echo/udp_echo/udp_echo_client.cpp"
              );
    file_05._12_4_ = 0;
    file_05.m_data = (char *)local_150._0_8_;
    file_05.m_size = local_150._8_4_;
    sznet::Logger::Logger(&local_1190,file_05,0x5c);
    psVar3 = sznet::LogStream::operator<<
                       (&local_1190.m_impl.m_stream,"first call sz_udp_send rst: ");
    sznet::LogStream::operator<<(psVar3,sVar2);
    sznet::Logger::~Logger(&local_1190);
  }
  sVar2 = sznet::net::sockets::sz_udp_send(sock_00,"hello",5,addr);
  if (sVar2 < 0) {
    sznet::Logger::SourceFile::SourceFile<115>
              ((SourceFile *)local_140,
               (char (*) [115])
               "/workspace/llm4binary/github/license_all_cmakelists_25/SunshineZzzz[P]sznet/test/echo/udp_echo/udp_echo_client.cpp"
              );
    file_09._12_4_ = 0;
    file_09.m_data = (char *)local_140._0_8_;
    file_09.m_size = local_140._8_4_;
    sznet::Logger::Logger(&local_1190,file_09,0x61,false);
    psVar3 = sznet::LogStream::operator<<
                       (&local_1190.m_impl.m_stream,"second call sz_udp_recv error: ");
    sznet::LogStream::operator<<(psVar3,sVar2);
    goto LAB_0011123b;
  }
  if (sznet::g_logLevel < 3) {
    sznet::Logger::SourceFile::SourceFile<115>
              ((SourceFile *)local_130,
               (char (*) [115])
               "/workspace/llm4binary/github/license_all_cmakelists_25/SunshineZzzz[P]sznet/test/echo/udp_echo/udp_echo_client.cpp"
              );
    file_06._12_4_ = 0;
    file_06.m_data = (char *)local_130._0_8_;
    file_06.m_size = local_130._8_4_;
    sznet::Logger::Logger(&local_1190,file_06,100);
    psVar3 = sznet::LogStream::operator<<
                       (&local_1190.m_impl.m_stream,"second call sz_udp_send rst: ");
    sznet::LogStream::operator<<(psVar3,sVar2);
    sznet::Logger::~Logger(&local_1190);
  }
  sVar2 = sznet::net::sockets::sz_udp_recv(sock_00,local_40,10,addr);
  if (sVar2 < 0) {
    sznet::Logger::SourceFile::SourceFile<115>
              ((SourceFile *)local_120,
               (char (*) [115])
               "/workspace/llm4binary/github/license_all_cmakelists_25/SunshineZzzz[P]sznet/test/echo/udp_echo/udp_echo_client.cpp"
              );
    file_10._12_4_ = 0;
    file_10.m_data = (char *)local_120._0_8_;
    file_10.m_size = local_120._8_4_;
    sznet::Logger::Logger(&local_1190,file_10,0x69,false);
    psVar3 = sznet::LogStream::operator<<(&local_1190.m_impl.m_stream,"sz_udp_recv error: ");
    sznet::LogStream::operator<<(psVar3,sVar2);
LAB_00110d76:
    sznet::Logger::~Logger(&local_1190);
    if (sznet::g_logLevel < 3) {
      sznet::Logger::SourceFile::SourceFile<115>
                ((SourceFile *)local_100,
                 (char (*) [115])
                 "/workspace/llm4binary/github/license_all_cmakelists_25/SunshineZzzz[P]sznet/test/echo/udp_echo/udp_echo_client.cpp"
                );
      file_11._12_4_ = 0;
      file_11.m_data = (char *)local_100._0_8_;
      file_11.m_size = local_100._8_4_;
      sznet::Logger::Logger(&local_1190,file_11,0x71);
      sznet::LogStream::operator<<(&local_1190.m_impl.m_stream,"TEST2 END, connect, block");
      sznet::Logger::~Logger(&local_1190);
      if (sznet::g_logLevel < 3) {
        sznet::Logger::SourceFile::SourceFile<115>
                  ((SourceFile *)local_f0,
                   (char (*) [115])
                   "/workspace/llm4binary/github/license_all_cmakelists_25/SunshineZzzz[P]sznet/test/echo/udp_echo/udp_echo_client.cpp"
                  );
        file_12._12_4_ = 0;
        file_12.m_data = (char *)local_f0._0_8_;
        file_12.m_size = local_f0._8_4_;
        sznet::Logger::Logger(&local_1190,file_12,0x7a);
        sznet::LogStream::operator<<(&local_1190.m_impl.m_stream,"TEST3 BEGIN, connect, noblock");
        sznet::Logger::~Logger(&local_1190);
      }
    }
  }
  else {
    recv[sVar2 + -8] = '\0';
    if (sznet::g_logLevel < 3) {
      sznet::Logger::SourceFile::SourceFile<115>
                ((SourceFile *)local_110,
                 (char (*) [115])
                 "/workspace/llm4binary/github/license_all_cmakelists_25/SunshineZzzz[P]sznet/test/echo/udp_echo/udp_echo_client.cpp"
                );
      file_07._12_4_ = 0;
      file_07.m_data = (char *)local_110._0_8_;
      file_07.m_size = local_110._8_4_;
      sznet::Logger::Logger(&local_1190,file_07,0x6e);
      psVar3 = sznet::LogStream::operator<<(&local_1190.m_impl.m_stream,"sz_udp_recv rst: ");
      pLVar4 = sznet::LogStream::operator<<(psVar3,sVar2);
      psVar3 = sznet::LogStream::operator<<(pLVar4,", recv msg: ");
      sznet::LogStream::operator<<(psVar3,local_40);
      goto LAB_00110d76;
    }
  }
  sznet::net::sockets::sz_sock_setnonblock(sock_00,true);
  sznet::net::sockets::sz_sock_connect(sock_00,addr);
  sVar2 = sznet::net::sockets::sz_udp_send(sock_00,"hello",5,addr);
  if (sVar2 < 0) {
    sznet::Logger::SourceFile::SourceFile<115>
              ((SourceFile *)local_e0,
               (char (*) [115])
               "/workspace/llm4binary/github/license_all_cmakelists_25/SunshineZzzz[P]sznet/test/echo/udp_echo/udp_echo_client.cpp"
              );
    file_15._12_4_ = 0;
    file_15.m_data = (char *)local_e0._0_8_;
    file_15.m_size = local_e0._8_4_;
    sznet::Logger::Logger(&local_1190,file_15,0x81,false);
    psVar3 = sznet::LogStream::operator<<(&local_1190.m_impl.m_stream,"call sz_udp_recv error: ");
    sznet::LogStream::operator<<(psVar3,sVar2);
    goto LAB_0011123b;
  }
  if (sznet::g_logLevel < 3) {
    sznet::Logger::SourceFile::SourceFile<115>
              ((SourceFile *)local_d0,
               (char (*) [115])
               "/workspace/llm4binary/github/license_all_cmakelists_25/SunshineZzzz[P]sznet/test/echo/udp_echo/udp_echo_client.cpp"
              );
    file_13._12_4_ = 0;
    file_13.m_data = (char *)local_d0._0_8_;
    file_13.m_size = local_d0._8_4_;
    sznet::Logger::Logger(&local_1190,file_13,0x84);
    psVar3 = sznet::LogStream::operator<<(&local_1190.m_impl.m_stream,"call sz_udp_send rst: ");
    sznet::LogStream::operator<<(psVar3,sVar2);
    sznet::Logger::~Logger(&local_1190);
  }
  sVar2 = sznet::net::sockets::sz_udp_recv(sock_00,local_40,10,addr);
  if (sVar2 < 0) {
    bVar1 = sznet::net::sockets::sz_wouldblock();
    if (bVar1) {
      if (2 < sznet::g_logLevel) goto LAB_0011110f;
      sznet::Logger::SourceFile::SourceFile<115>
                ((SourceFile *)local_c0,
                 (char (*) [115])
                 "/workspace/llm4binary/github/license_all_cmakelists_25/SunshineZzzz[P]sznet/test/echo/udp_echo/udp_echo_client.cpp"
                );
      file_16._12_4_ = 0;
      file_16.m_data = (char *)local_c0._0_8_;
      file_16.m_size = local_c0._8_4_;
      sznet::Logger::Logger(&local_1190,file_16,0x8b);
      sznet::LogStream::operator<<(&local_1190.m_impl.m_stream,"async recv");
    }
    else {
      sznet::Logger::SourceFile::SourceFile<115>
                ((SourceFile *)local_b0,
                 (char (*) [115])
                 "/workspace/llm4binary/github/license_all_cmakelists_25/SunshineZzzz[P]sznet/test/echo/udp_echo/udp_echo_client.cpp"
                );
      file_17._12_4_ = 0;
      file_17.m_data = (char *)local_b0._0_8_;
      file_17.m_size = local_b0._8_4_;
      sznet::Logger::Logger(&local_1190,file_17,0x8f,false);
      psVar3 = sznet::LogStream::operator<<(&local_1190.m_impl.m_stream,"sz_udp_recv error: ");
      sznet::LogStream::operator<<(psVar3,sVar2);
    }
LAB_0011105a:
    sznet::Logger::~Logger(&local_1190);
    if (sznet::g_logLevel < 3) {
      sznet::Logger::SourceFile::SourceFile<115>
                ((SourceFile *)local_90,
                 (char (*) [115])
                 "/workspace/llm4binary/github/license_all_cmakelists_25/SunshineZzzz[P]sznet/test/echo/udp_echo/udp_echo_client.cpp"
                );
      file_18._12_4_ = 0;
      file_18.m_data = (char *)local_90._0_8_;
      file_18.m_size = local_90._8_4_;
      sznet::Logger::Logger(&local_1190,file_18,0x98);
      sznet::LogStream::operator<<(&local_1190.m_impl.m_stream,"TEST2 END, connect, block");
      sznet::Logger::~Logger(&local_1190);
      if (sznet::g_logLevel < 3) {
        sznet::Logger::SourceFile::SourceFile<115>
                  ((SourceFile *)local_80,
                   (char (*) [115])
                   "/workspace/llm4binary/github/license_all_cmakelists_25/SunshineZzzz[P]sznet/test/echo/udp_echo/udp_echo_client.cpp"
                  );
        file_19._12_4_ = 0;
        file_19.m_data = (char *)local_80._0_8_;
        file_19.m_size = local_80._8_4_;
        sznet::Logger::Logger(&local_1190,file_19,0x9e);
        sznet::LogStream::operator<<(&local_1190.m_impl.m_stream,"TEST4 BEGIN, no connect, block");
        sznet::Logger::~Logger(&local_1190);
      }
    }
  }
  else {
    recv[sVar2 + -8] = '\0';
    if (sznet::g_logLevel < 3) {
      sznet::Logger::SourceFile::SourceFile<115>
                ((SourceFile *)local_a0,
                 (char (*) [115])
                 "/workspace/llm4binary/github/license_all_cmakelists_25/SunshineZzzz[P]sznet/test/echo/udp_echo/udp_echo_client.cpp"
                );
      file_14._12_4_ = 0;
      file_14.m_data = (char *)local_a0._0_8_;
      file_14.m_size = local_a0._8_4_;
      sznet::Logger::Logger(&local_1190,file_14,0x95);
      psVar3 = sznet::LogStream::operator<<(&local_1190.m_impl.m_stream,"sz_udp_recv rst: ");
      pLVar4 = sznet::LogStream::operator<<(psVar3,sVar2);
      psVar3 = sznet::LogStream::operator<<(pLVar4,", recv msg: ");
      sznet::LogStream::operator<<(psVar3,local_40);
      goto LAB_0011105a;
    }
  }
LAB_0011110f:
  sVar2 = sznet::net::sockets::sz_udp_recv(sock_00,local_40,10,addr);
  if (sVar2 < 0) {
    sznet::Logger::SourceFile::SourceFile<115>
              ((SourceFile *)local_70,
               (char (*) [115])
               "/workspace/llm4binary/github/license_all_cmakelists_25/SunshineZzzz[P]sznet/test/echo/udp_echo/udp_echo_client.cpp"
              );
    file_21._12_4_ = 0;
    file_21.m_data = (char *)local_70._0_8_;
    file_21.m_size = local_70._8_4_;
    sznet::Logger::Logger(&local_1190,file_21,0xa3,false);
    psVar3 = sznet::LogStream::operator<<(&local_1190.m_impl.m_stream,"sz_udp_recv error: ");
    sznet::LogStream::operator<<(psVar3,sVar2);
  }
  else {
    recv[sVar2 + -8] = '\0';
    if (2 < sznet::g_logLevel) {
      return;
    }
    sznet::Logger::SourceFile::SourceFile<115>
              ((SourceFile *)local_60,
               (char (*) [115])
               "/workspace/llm4binary/github/license_all_cmakelists_25/SunshineZzzz[P]sznet/test/echo/udp_echo/udp_echo_client.cpp"
              );
    file_20._12_4_ = 0;
    file_20.m_data = (char *)local_60._0_8_;
    file_20.m_size = local_60._8_4_;
    sznet::Logger::Logger(&local_1190,file_20,0xa8);
    psVar3 = sznet::LogStream::operator<<(&local_1190.m_impl.m_stream,"sz_udp_recv rst: ");
    pLVar4 = sznet::LogStream::operator<<(psVar3,sVar2);
    psVar3 = sznet::LogStream::operator<<(pLVar4,", recv msg: ");
    sznet::LogStream::operator<<(psVar3,local_40);
  }
  sznet::Logger::~Logger(&local_1190);
  if (2 < sznet::g_logLevel) {
    return;
  }
  sznet::Logger::SourceFile::SourceFile<115>
            ((SourceFile *)local_50,
             (char (*) [115])
             "/workspace/llm4binary/github/license_all_cmakelists_25/SunshineZzzz[P]sznet/test/echo/udp_echo/udp_echo_client.cpp"
            );
  file_22._12_4_ = 0;
  file_22.m_data = (char *)local_50._0_8_;
  file_22.m_size = local_50._8_4_;
  sznet::Logger::Logger(&local_1190,file_22,0xab);
  sznet::LogStream::operator<<(&local_1190.m_impl.m_stream,"TEST4 END, no connect, block");
LAB_0011123b:
  sznet::Logger::~Logger(&local_1190);
  return;
}

Assistant:

void HaveATest(Socket& sock, const InetAddress& serverAddr)
{
    struct sockaddr * serverSockAddr = const_cast<struct sockaddr*>(serverAddr.getSockAddr());
    sockets::sz_sock csock = sock.fd();
    const char* msg = "hello";
    const void* sendMsg = reinterpret_cast<const void*>(msg);
    int sendLen = static_cast<int>(strlen(msg));
    char recv[10] = {};
    void* recvBuf = reinterpret_cast<void*>(recv);
    int recvLen = 10;
    sz_ssize_t rst = 0;

    // ��ʹ��connect��block
    // 1.��������socket��������û�п����������£�UDPû������û�г��ַ�����Ϣ���������������ҷ���ֵ��ȷ
    // 2.��������socket�������˿����������£�UDP��������Ϣ������ֵ��ȷ
    // 3.��������socket��������û�п����������£�UDP������Ϣֱ�ӷ���-1
    // 4.��������socket�������˿����������£�������û�з�����Ϣ��UDP����������Ϣ����������ʱ���ֶ��رշ����ˣ�����������
    // �����˷���Ϣ����������
    do
    {
        LOG_INFO << "TEST1 BEGIN, no connect, block";
        rst = sockets::sz_udp_send(csock, sendMsg, sendLen, serverSockAddr);
        LOG_INFO << "sz_udp_send rst: " << rst;

        rst = sockets::sz_udp_recv(csock, recvBuf, recvLen, serverSockAddr);
        if (rst < 0)
        {
            LOG_SYSERR << "sz_udp_recv error: " << rst;
        }
        else
        {
            recv[rst] = 0;
            LOG_INFO << "sz_udp_recv rst: " << rst << ", recv msg: " << recv;
        }

        LOG_INFO << "TEST1 END, no connect, block";
    } while (false);

    // UDPΪʲôҪʹ��connect��������·�ɵķ�ʱ�䣬�������Կ���
    // https://stackoverflow.com/questions/9741392/can-you-bind-and-connect-both-ends-of-a-udp-connection
    // ʹ��connect��block
    // 1.��������socket����������connect��������û�п����������£�UDPû������û�г��ַ�����Ϣ���������������ҷ���ֵ��ȷ
    // ����2�ο����ڶ����Ƿ񱨴���������û�б���
    // 2.��������socket����������connect�������˿����������£�UDP��������Ϣ������ֵ��ȷ
    // 3.��������socket����������connect��������û�п����������£�UDP������Ϣֱ�ӷ���-1
    // 4.��������socket����������connect�������˿����������£�������û�з�����Ϣ��UDP����������Ϣ����������ʱ���ֶ��رշ����ˣ�����������
    // �����˷���Ϣ����������
    do
    {
        LOG_INFO << "TEST2 BEGIN, connect, block";

        sockets::sz_sock_connect(csock, serverSockAddr);
        rst = sockets::sz_udp_send(csock, sendMsg, sendLen, serverSockAddr);
        if (rst < 0)
        {
            LOG_SYSERR << "first call sz_udp_recv error: " << rst;
            return;
        }
        LOG_INFO << "first call sz_udp_send rst: " << rst;

        rst = sockets::sz_udp_send(csock, sendMsg, sendLen, serverSockAddr);
        if (rst < 0)
        {
            LOG_SYSERR << "second call sz_udp_recv error: " << rst;
            return;
        }
        LOG_INFO << "second call sz_udp_send rst: " << rst;

        rst = sockets::sz_udp_recv(csock, recvBuf, recvLen, serverSockAddr);
        if (rst < 0)
        {
            LOG_SYSERR << "sz_udp_recv error: " << rst;
        }
        else
        {
            recv[rst] = 0;
            LOG_INFO << "sz_udp_recv rst: " << rst << ", recv msg: " << recv;
        }

        LOG_INFO << "TEST2 END, connect, block";
    } while (false);

    // 1.���Է�����socket����������connect��������û�п����������£�����ֵ��ȷ
    // 2.��������socket����������connect�������˿����������£�UDP��������Ϣ������ֵ��ȷ
    // 3.��������socket����������connect��������û�п����������£�UDP������Ϣֱ�ӷ���-1
    // 4.��������socket����������connect�������˿����������£�������û�з�����Ϣ��UDP������������Ϣ
    do
    {
        LOG_INFO << "TEST3 BEGIN, connect, noblock";

        sockets::sz_sock_setnonblock(csock, true);
        sockets::sz_sock_connect(csock, serverSockAddr);
        rst = sockets::sz_udp_send(csock, sendMsg, sendLen, serverSockAddr);
        if (rst < 0)
        {
            LOG_SYSERR << "call sz_udp_recv error: " << rst;
            return;
        }
        LOG_INFO << "call sz_udp_send rst: " << rst;

        rst = sockets::sz_udp_recv(csock, recvBuf, recvLen, serverSockAddr);
        if (rst < 0)
        {
            if (sockets::sz_wouldblock())
            {
                LOG_INFO << "async recv";
            }
            else
            {
                LOG_SYSERR << "sz_udp_recv error: " << rst;
            }
        }
        else
        {
            recv[rst] = 0;
            LOG_INFO << "sz_udp_recv rst: " << rst << ", recv msg: " << recv;
        }

        LOG_INFO << "TEST2 END, connect, block";
    } while (false);

    // ��������û�п����������ͣ�ֱ�ӽ��գ�����-1
    do
    {
        LOG_INFO << "TEST4 BEGIN, no connect, block";

        rst = sockets::sz_udp_recv(csock, recvBuf, recvLen, serverSockAddr);
        if (rst < 0)
        {
            LOG_SYSERR << "sz_udp_recv error: " << rst;
        }
        else
        {
            recv[rst] = 0;
            LOG_INFO << "sz_udp_recv rst: " << rst << ", recv msg: " << recv;
        }

        LOG_INFO << "TEST4 END, no connect, block";
    } while (false);
}